

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_storage_batch.c
# Opt level: O0

int log_policy_storage_batch_create(log_policy policy,log_policy_ctor ctor)

{
  long *instance;
  void *pvVar1;
  ulong *in_RSI;
  log_policy in_RDI;
  log_policy_storage_batch_ctor batch_ctor;
  log_policy_storage_batch_data batch_data;
  int local_4;
  
  instance = (long *)malloc(0x18);
  if (instance == (long *)0x0) {
    local_4 = 1;
  }
  else {
    instance[1] = 0;
    if (((in_RSI == (ulong *)0x0) || (*in_RSI < 0x200)) || (0x10000 < *in_RSI)) {
      instance[2] = 0x200;
    }
    else {
      instance[2] = *in_RSI;
    }
    pvVar1 = malloc(instance[2]);
    *instance = (long)pvVar1;
    if (*instance == 0) {
      free(instance);
      local_4 = 1;
    }
    else {
      log_policy_instantiate(in_RDI,instance,0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int log_policy_storage_batch_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_storage_batch_data batch_data = malloc(sizeof(struct log_policy_storage_batch_data_type));

	const log_policy_storage_batch_ctor batch_ctor = ctor;

	if (batch_data == NULL)
	{
		return 1;
	}

	batch_data->count = 0;

	if (batch_ctor != NULL && batch_ctor->size >= LOG_POLICY_STORAGE_BATCH_MIN_SIZE && batch_ctor->size <= LOG_POLICY_STORAGE_BATCH_MAX_SIZE)
	{
		batch_data->size = batch_ctor->size;
	}
	else
	{
		batch_data->size = LOG_POLICY_STORAGE_BATCH_MIN_SIZE;
	}

	batch_data->buffer = malloc(batch_data->size);

	if (batch_data->buffer == NULL)
	{
		free(batch_data);

		return 1;
	}

	log_policy_instantiate(policy, batch_data, LOG_POLICY_STORAGE_BATCH);

	return 0;
}